

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double erlang_sample(double a,double b,int c,int *seed)

{
  double dVar1;
  double x2;
  double x;
  int i;
  double b2;
  double a2;
  int *seed_local;
  int c_local;
  double b_local;
  double a_local;
  
  x2 = a;
  for (x._4_4_ = 1; x._4_4_ <= c; x._4_4_ = x._4_4_ + 1) {
    dVar1 = exponential_sample(0.0,b,seed);
    x2 = x2 + dVar1;
  }
  return x2;
}

Assistant:

double erlang_sample ( double a, double b, int c, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_SAMPLE samples the Erlang PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double ERLANG_SAMPLE, a sample of the PDF.
//
{
  double a2;
  double b2;
  int i;
  double x;
  double x2;

  a2 = 0.0;
  b2 = b;
  x = a;

  for ( i = 1; i <= c; i++ )
  {
    x2 = exponential_sample ( a2, b2, seed );
    x = x + x2;
  }

  return x;
}